

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O1

clip_ctx * clip_init(char *fname,clip_context_params ctx_params)

{
  clip_ctx *this;
  clip_model_loader loader;
  clip_model_loader local_70;
  clip_context_params local_30;
  
  local_30.verbosity = ctx_params.verbosity;
  g_logger_state.verbosity_thold = local_30.verbosity;
  local_30 = ctx_params;
  this = (clip_ctx *)operator_new(0x3b0);
  clip_ctx::clip_ctx(this,&local_30);
  clip_model_loader::clip_model_loader(&local_70,fname,this);
  clip_model_loader::load_hparams(&local_70);
  clip_model_loader::load_tensors(&local_70);
  clip_model_loader::alloc_compute_meta(&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.fname._M_dataplus._M_p != &local_70.fname.field_2) {
    operator_delete(local_70.fname._M_dataplus._M_p,local_70.fname.field_2._M_allocated_capacity + 1
                   );
  }
  std::unique_ptr<gguf_context,_gguf_context_deleter>::~unique_ptr(&local_70.ctx_gguf);
  std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr(&local_70.ctx_meta);
  return this;
}

Assistant:

struct clip_ctx * clip_init(const char * fname, struct clip_context_params ctx_params) {
    g_logger_state.verbosity_thold = ctx_params.verbosity;
    clip_ctx * ctx_clip = new clip_ctx(ctx_params);

    try {
        clip_model_loader loader(fname, *ctx_clip);
        loader.load_hparams();
        loader.load_tensors();
        loader.alloc_compute_meta();
    } catch (const std::exception & e) {
        LOG_ERR("%s: failed to load model '%s': %s\n", __func__, fname, e.what());
        delete ctx_clip;
        return nullptr;
    }

    return ctx_clip;
}